

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::ConfidentialTransaction::RandomSortTxOut(ConfidentialTransaction *this)

{
  ConfidentialTxOutReference *pCVar1;
  ConfidentialValue *pCVar2;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *this_00;
  bool bVar3;
  ConfidentialValue *pCVar4;
  const_reference this_01;
  CfdException *this_02;
  size_type sVar5;
  ConfidentialTxOutReference *pCVar6;
  reference pvVar7;
  Amount AVar8;
  ByteData local_1e8;
  ByteData local_1d0;
  ConfidentialNonce local_1b8;
  Script local_190;
  ConfidentialAssetId local_158;
  int64_t local_130;
  undefined1 local_128;
  ConfidentialValue local_120;
  Amount local_f8;
  const_reference local_e8;
  ConfidentialTxOutReference *txout;
  size_t index_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  size_t index_1;
  string local_b0;
  CfdSourceLocation local_90;
  ConfidentialValue local_68;
  ConfidentialValue *local_40;
  ConfidentialValue *value;
  size_t index;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *local_18;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *txout_list;
  ConfidentialTransaction *this_local;
  
  txout_list = (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                *)this;
  GetTxOutList((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                *)&index,this);
  local_18 = (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              *)&index;
  value = (ConfidentialValue *)0x0;
  while( true ) {
    pCVar2 = value;
    pCVar4 = (ConfidentialValue *)
             ::std::
             vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             ::size(local_18);
    if (pCVar4 <= pCVar2) {
      for (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage =
                (pointer)::std::
                         vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                         ::size(local_18);
          indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
          indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)indexes.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + -1)) {
        RemoveTxOut(this,(int)indexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - 1);
      }
      sVar5 = ::std::
              vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ::size(local_18);
      RandomNumberUtil::GetRandomIndexes
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index_2,(uint32_t)sVar5);
      txout = (ConfidentialTxOutReference *)0x0;
      while( true ) {
        pCVar1 = txout;
        pCVar6 = (ConfidentialTxOutReference *)
                 ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index_2);
        this_00 = local_18;
        if (pCVar6 <= pCVar1) break;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index_2,
                            (size_type)txout);
        local_e8 = ::std::
                   vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ::operator[](this_00,(ulong)*pvVar7);
        ConfidentialTxOutReference::GetConfidentialValue(&local_120,local_e8);
        AVar8 = ConfidentialValue::GetAmount(&local_120);
        local_130 = AVar8.amount_;
        local_128 = AVar8.ignore_check_;
        local_f8.amount_ = local_130;
        local_f8.ignore_check_ = (bool)local_128;
        ConfidentialTxOutReference::GetAsset(&local_158,local_e8);
        AbstractTxOutReference::GetLockingScript(&local_190,&local_e8->super_AbstractTxOutReference)
        ;
        ConfidentialTxOutReference::GetNonce(&local_1b8,local_e8);
        ConfidentialTxOutReference::GetSurjectionProof(&local_1d0,local_e8);
        ConfidentialTxOutReference::GetRangeProof(&local_1e8,local_e8);
        AddTxOut(this,&local_f8,&local_158,&local_190,&local_1b8,&local_1d0,&local_1e8);
        ByteData::~ByteData(&local_1e8);
        ByteData::~ByteData(&local_1d0);
        ConfidentialNonce::~ConfidentialNonce(&local_1b8);
        Script::~Script(&local_190);
        ConfidentialAssetId::~ConfidentialAssetId(&local_158);
        ConfidentialValue::~ConfidentialValue(&local_120);
        txout = (ConfidentialTxOutReference *)
                ((long)&(txout->super_AbstractTxOutReference)._vptr_AbstractTxOutReference + 1);
      }
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index_2);
      ::std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 *)&index);
      return;
    }
    this_01 = ::std::
              vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ::operator[](local_18,(size_type)value);
    ConfidentialTxOutReference::GetConfidentialValue(&local_68,this_01);
    local_40 = &local_68;
    bVar3 = ConfidentialValue::HasBlinding(local_40);
    if (bVar3) break;
    ConfidentialValue::~ConfidentialValue(&local_68);
    value = (ConfidentialValue *)((long)&value->_vptr_ConfidentialValue + 1);
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0xc23;
  local_90.funcname = "RandomSortTxOut";
  logger::warn<>(&local_90,"already blinded tx");
  index_1._6_1_ = 1;
  this_02 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_b0,"already blinded tx",(allocator *)((long)&index_1 + 7));
  CfdException::CfdException(this_02,kCfdIllegalArgumentError,&local_b0);
  index_1._6_1_ = 0;
  __cxa_throw(this_02,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::RandomSortTxOut() {
  const std::vector<ConfidentialTxOutReference> &txout_list = GetTxOutList();
  // blind check
  for (size_t index = 0; index < txout_list.size(); ++index) {
    const ConfidentialValue &value = txout_list[index].GetConfidentialValue();
    if (value.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "already blinded tx");
      throw CfdException(kCfdIllegalArgumentError, "already blinded tx");
    }
  }
  for (size_t index = txout_list.size(); index > 0; --index) {
    RemoveTxOut(static_cast<uint32_t>(index - 1));
  }

  std::vector<uint32_t> indexes = RandomNumberUtil::GetRandomIndexes(
      static_cast<uint32_t>(txout_list.size()));
  for (size_t index = 0; index < indexes.size(); ++index) {
    const ConfidentialTxOutReference &txout = txout_list[indexes[index]];
    AddTxOut(
        txout.GetConfidentialValue().GetAmount(), txout.GetAsset(),
        txout.GetLockingScript(), txout.GetNonce(), txout.GetSurjectionProof(),
        txout.GetRangeProof());
  }
}